

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonMonteCarloPricer.cpp
# Opt level: O3

double __thiscall
VarianceSwapsHestonMonteCarloPricer::pathPrice
          (VarianceSwapsHestonMonteCarloPricer *this,vector<double,_std::allocator<double>_> *path,
          double maturity)

{
  double *pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  pdVar2 = (path->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(path->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
  if (lVar3 == 1) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    lVar4 = 1;
    dVar6 = *pdVar2;
    do {
      pdVar1 = pdVar2 + lVar4;
      dVar6 = *pdVar1 - dVar6;
      dVar5 = dVar5 + dVar6 * dVar6;
      lVar4 = lVar4 + 1;
      dVar6 = *pdVar1;
    } while (lVar3 != lVar4);
    dVar5 = dVar5 * 10000.0;
  }
  return dVar5 / maturity;
}

Assistant:

double VarianceSwapsHestonMonteCarloPricer::pathPrice(std::vector<double> path,
                                                double maturity) const
{
    double pathPrice = 0.0; 
    for(size_t i = 0; i < path.size()-1; i++)
    {   
        pathPrice += std::pow(path[i+1]-path[i],2); //Reminder : path[i] = log(S_ti) 
    }
    return 100*100*pathPrice/maturity;
}